

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::TrodesMsg(TrodesMsg *this)

{
  zmsg_t *pzVar1;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  pzVar1 = zmsg_new();
  *(zmsg_t **)(in_RDI + 0x20) = pzVar1;
  return;
}

Assistant:

TrodesMsg::TrodesMsg()
{
    msg = zmsg_new();
}